

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotShadedEx<ImPlot::GetterYs<float>,ImPlot::GetterYRef>
               (char *label_id,GetterYs<float> *getter1,GetterYRef *getter2,bool fit2)

{
  float fVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  float *pfVar9;
  ImPlotPlot *pIVar10;
  ImPlotRange *pIVar11;
  ImPlotContext *pIVar12;
  bool bVar13;
  int iVar14;
  ImU32 col;
  ImDrawList *DrawList;
  undefined7 in_register_00000009;
  byte bVar15;
  int iVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  TransformerLinLin local_7c;
  GetterYRef *local_78;
  GetterYs<float> *local_70;
  undefined4 local_68;
  uint local_64;
  ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin> local_60;
  
  bVar13 = BeginItem(label_id,1);
  pIVar12 = GImPlot;
  if (bVar13) {
    if (GImPlot->FitThisFrame == true) {
      local_68 = (undefined4)CONCAT71(in_register_00000009,fit2);
      iVar14 = getter1->Count;
      if (0 < iVar14) {
        dVar2 = getter1->X0;
        dVar3 = getter1->XScale;
        pfVar9 = getter1->Ys;
        iVar4 = getter1->Offset;
        iVar5 = getter1->Stride;
        pIVar10 = GImPlot->CurrentPlot;
        iVar6 = pIVar10->CurrentYAxis;
        uVar7 = (pIVar10->XAxis).Flags;
        pIVar11 = GImPlot->ExtentsY;
        uVar8 = pIVar10->YAxis[iVar6].Flags;
        iVar16 = 0;
        local_64 = uVar8 & 0x20;
        dVar17 = 0.0;
        do {
          dVar21 = dVar3 * dVar17 + dVar2;
          fVar1 = *(float *)((long)pfVar9 +
                            (long)(((iVar4 + iVar16) % iVar14 + iVar14) % iVar14) * (long)iVar5);
          dVar18 = (double)fVar1;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((long)ABS(dVar21) < 0x7ff0000000000000) {
LAB_001ebbfd:
              if ((0.0 < dVar21) || ((uVar7 & 0x20) == 0)) {
                dVar19 = (pIVar12->ExtentsX).Min;
                dVar20 = dVar21;
                if (dVar19 <= dVar21) {
                  dVar20 = dVar19;
                }
                (pIVar12->ExtentsX).Min = dVar20;
                dVar19 = (pIVar12->ExtentsX).Max;
                dVar20 = dVar21;
                if (dVar21 <= dVar19) {
                  dVar20 = dVar19;
                }
                (pIVar12->ExtentsX).Max = dVar20;
              }
            }
          }
          else if ((((long)ABS(dVar21) < 0x7ff0000000000000) &&
                   (pIVar10->YAxis[iVar6].Range.Min <= dVar18)) &&
                  (dVar18 <= pIVar10->YAxis[iVar6].Range.Max)) goto LAB_001ebbfd;
          if ((uVar8 >> 10 & 1) == 0) {
            if ((long)ABS(dVar18) < 0x7ff0000000000000) {
LAB_001ebc6d:
              if ((0.0 < fVar1) || (local_64 == 0)) {
                dVar21 = pIVar11[iVar6].Min;
                dVar19 = dVar18;
                if (dVar21 <= dVar18) {
                  dVar19 = dVar21;
                }
                pIVar11[iVar6].Min = dVar19;
                dVar21 = pIVar12->ExtentsY[iVar6].Max;
                if (dVar18 <= dVar21) {
                  dVar18 = dVar21;
                }
                pIVar12->ExtentsY[iVar6].Max = dVar18;
              }
            }
          }
          else if ((((long)ABS(dVar18) < 0x7ff0000000000000) &&
                   ((pIVar10->XAxis).Range.Min <= dVar21)) && (dVar21 <= (pIVar10->XAxis).Range.Max)
                  ) goto LAB_001ebc6d;
          dVar17 = dVar17 + 1.0;
          iVar16 = iVar16 + 1;
        } while (iVar14 != iVar16);
      }
      if ((fit2) && (iVar14 = getter2->Count, 0 < iVar14)) {
        dVar2 = getter2->X0;
        dVar3 = getter2->YRef;
        dVar17 = getter2->XScale;
        pIVar10 = pIVar12->CurrentPlot;
        iVar4 = pIVar10->CurrentYAxis;
        uVar7 = (pIVar10->XAxis).Flags;
        uVar8 = pIVar10->YAxis[iVar4].Flags;
        pIVar11 = pIVar12->ExtentsY + iVar4;
        bVar15 = dVar3 <= 0.0 & (byte)((uVar8 & 0x20) >> 5);
        dVar18 = 0.0;
        do {
          dVar21 = dVar17 * dVar18 + dVar2;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((long)ABS(dVar21) < 0x7ff0000000000000) {
LAB_001ebd8d:
              if ((0.0 < dVar21) || ((uVar7 & 0x20) == 0)) {
                dVar19 = (pIVar12->ExtentsX).Min;
                dVar20 = dVar21;
                if (dVar19 <= dVar21) {
                  dVar20 = dVar19;
                }
                (pIVar12->ExtentsX).Min = dVar20;
                dVar19 = (pIVar12->ExtentsX).Max;
                dVar20 = dVar21;
                if (dVar21 <= dVar19) {
                  dVar20 = dVar19;
                }
                (pIVar12->ExtentsX).Max = dVar20;
              }
            }
          }
          else if ((((long)ABS(dVar21) < 0x7ff0000000000000) &&
                   (pIVar10->YAxis[iVar4].Range.Min <= dVar3)) &&
                  (dVar3 <= pIVar10->YAxis[iVar4].Range.Max)) goto LAB_001ebd8d;
          if ((uVar8 >> 10 & 1) == 0) {
            if ((ulong)ABS(dVar3) < 0x7ff0000000000000 && bVar15 == 0) {
LAB_001ebdd0:
              dVar21 = dVar3;
              if (pIVar11->Min <= dVar3) {
                dVar21 = pIVar11->Min;
              }
              pIVar11->Min = dVar21;
              dVar21 = dVar3;
              if (dVar3 <= pIVar11->Max) {
                dVar21 = pIVar11->Max;
              }
              pIVar11->Max = dVar21;
            }
          }
          else if (((ulong)ABS(dVar3) < 0x7ff0000000000000 && bVar15 == 0) &&
                   ((pIVar10->XAxis).Range.Min <= dVar21 && dVar21 <= (pIVar10->XAxis).Range.Max))
          goto LAB_001ebdd0;
          dVar18 = dVar18 + 1.0;
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
      }
    }
    local_78 = getter2;
    local_70 = getter1;
    DrawList = GetPlotDrawList();
    if ((pIVar12->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar12->NextItemData).Colors + 1);
      switch(GImPlot->Scales[GImPlot->CurrentPlot->CurrentYAxis]) {
      case 0:
        local_7c.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>::
        ShadedRenderer(&local_60,local_70,local_78,&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_7c.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
        ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                        *)&local_60,local_70,local_78,(TransformerLogLin *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_7c.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>::
        ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                        *)&local_60,local_70,local_78,(TransformerLinLog *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_7c.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>::
        ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
                        *)&local_60,local_70,local_78,(TransformerLogLog *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar12 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar12->NextItemData);
    pIVar12->PreviousItem = pIVar12->CurrentItem;
    pIVar12->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}